

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemTxResult
address_space_write_riscv64(AddressSpace *as,hwaddr addr,MemTxAttrs attrs,void *buf,hwaddr len)

{
  MemTxResult MVar1;
  
  if (len != 0) {
    MVar1 = flatview_write((uc_struct_conflict13 *)as->uc,as->current_map,addr,attrs,buf,len);
    return MVar1;
  }
  return 0;
}

Assistant:

MemTxResult address_space_write(AddressSpace *as, hwaddr addr,
                                MemTxAttrs attrs,
                                const void *buf, hwaddr len)
{
    MemTxResult result = MEMTX_OK;
    FlatView *fv;

    if (len > 0) {
        fv = address_space_to_flatview(as);
        result = flatview_write(as->uc, fv, addr, attrs, buf, len);
    }

    return result;
}